

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O3

bool crnlib::dxt_fast::determine_selectors
               (uint n,color_quad_u8 *block,uint min16,uint max16,uint8 *pSelectors)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint8 uVar5;
  int stops [4];
  byte local_48 [16];
  int local_38 [4];
  
  if (max16 == min16) {
    bVar2 = false;
    memset(pSelectors,0,(ulong)n);
  }
  else {
    local_48[0] = ryg_dxt::Expand5[min16 >> 0xb & 0x1f];
    local_48[1] = ryg_dxt::Expand6[min16 >> 5 & 0x3f];
    local_48[2] = ryg_dxt::Expand5[min16 & 0x1f];
    local_48[4] = ryg_dxt::Expand5[max16 >> 0xb & 0x1f];
    local_48[5] = ryg_dxt::Expand6[max16 >> 5 & 0x3f];
    local_48[6] = ryg_dxt::Expand5[max16 & 0x1f];
    local_48[8] = (char)(((uint)local_48[4] + (uint)local_48[0] * 2) / 3);
    local_48[9] = (char)(((uint)local_48[5] + (uint)local_48[1] * 2) / 3);
    local_48[10] = (char)(((uint)local_48[6] + (uint)local_48[2] * 2) / 3);
    local_48[0xc] = (char)(((uint)local_48[0] + (uint)local_48[4] * 2) / 3);
    local_48[0xd] = (char)(((uint)local_48[1] + (uint)local_48[5] * 2) / 3);
    local_48[0xe] = (char)(((uint)local_48[2] + (uint)local_48[6] * 2) / 3);
    lVar1 = 0;
    do {
      local_38[lVar1] =
           (uint)*(byte *)((long)local_38 + lVar1 * 4 + -0xe) *
           ((uint)local_48[2] - (uint)local_48[6]) +
           (uint)*(byte *)((long)local_38 + lVar1 * 4 + -0xf) *
           ((uint)local_48[1] - (uint)local_48[5]) +
           (uint)*(byte *)(local_38 + lVar1 + -4) * ((uint)local_48[0] - (uint)local_48[4]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    if (n == 0) {
      bVar2 = false;
    }
    else {
      uVar4 = 0;
      bVar2 = false;
      do {
        iVar3 = (uint)block[uVar4].field_0.field_0.b * ((uint)local_48[2] - (uint)local_48[6]) +
                (uint)block[uVar4].field_0.field_0.g * ((uint)local_48[1] - (uint)local_48[5]) +
                (uint)block[uVar4].field_0.field_0.r * ((uint)local_48[0] - (uint)local_48[4]);
        uVar5 = (local_38[1] + local_38[3] >> 1 <= iVar3) * '\x02' + '\x01';
        if (local_38[3] + local_38[2] >> 1 <= iVar3) {
          uVar5 = (iVar3 < local_38[2] + local_38[0] >> 1) * '\x02';
        }
        pSelectors[uVar4] = uVar5;
        bVar2 = (bool)(bVar2 | uVar5 != *pSelectors);
        uVar4 = uVar4 + 1;
      } while (n != uVar4);
    }
  }
  return bVar2;
}

Assistant:

static bool determine_selectors(uint n, const color_quad_u8* block, uint min16, uint max16, uint8* pSelectors)
        {
            color_quad_u8 color[4];

            if (max16 != min16)
            {
                eval_colors(color, min16, max16);

                return match_block_colors(n, block, color, pSelectors);
            }

            memset(pSelectors, 0, n);
            return false;
        }